

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::rotateCounterClockwise(Entity *this)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  
  iVar1 = 0x10e;
  if (0 < this->rotation) {
    iVar1 = this->rotation + -0x5a;
  }
  this->rotation = iVar1;
  psVar2 = (string *)(**(code **)(*(long *)this + 0x40))();
  poVar3 = std::operator<<((ostream *)&std::cout,psVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Entity::rotateCounterClockwise() {
    rotation = rotation > 0 ? (rotation - 90) : 270;
    cout << *toString() << endl;
}